

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

void __thiscall QPDF::read_xref(QPDF *this,qpdf_offset_t xref_offset)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Base_ptr p_Var6;
  QPDFExc *pQVar7;
  uint uVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  long *plVar11;
  ulong *puVar12;
  size_type *psVar13;
  _Rb_tree_header *p_Var14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  uint uVar19;
  _Rb_tree_header *p_Var20;
  bool bVar21;
  uint uVar22;
  ulong uVar23;
  char buf [7];
  string __str_1;
  string __str;
  char ch;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> visited;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> free_table;
  undefined1 local_1f8 [32];
  long local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  string local_1b0;
  ulong *local_190;
  long local_188;
  ulong local_180 [2];
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130 [2];
  long local_120 [2];
  undefined1 local_110 [128];
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8 = xref_offset;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (xref_offset != 0) {
    do {
      std::
      _Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
      ::_M_insert_unique<long_long_const&>
                ((_Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
                  *)&local_90,&local_1d8);
      local_1d0 = (long *)((ulong)local_1d0 & 0xff00000000000000);
      plVar4 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar4 + 0x28))(plVar4,local_1d8,0);
      bVar21 = false;
      bVar17 = false;
      do {
        plVar4 = *(long **)&(((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
        lVar3 = (**(code **)(*plVar4 + 0x38))(plVar4,(QPDFExc *)local_110,1);
        if (lVar3 == 1) {
          bVar18 = true;
          if ((4 < (byte)local_110[0] - 9) && (local_110[0] != (runtime_error)0x20)) {
            plVar4 = *(long **)&(((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file
                                ).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
            bVar21 = true;
            (**(code **)(*plVar4 + 0x40))(plVar4,(int)(char)local_110[0]);
            bVar18 = bVar17;
          }
        }
        else {
          bVar21 = true;
          bVar18 = bVar17;
        }
        bVar17 = bVar18;
      } while (!bVar21);
      plVar4 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar4 + 0x38))(plVar4,&local_1d0,6);
      if (((int)local_1d0 == 0x66657278) && ((local_1d0._4_1_ - 9 < 5 || (local_1d0._4_1_ == 0x20)))
         ) {
        if (bVar18) {
          local_1f8._0_8_ = local_1f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
          local_1b0._M_dataplus._M_p = (pointer)((long)&local_1b0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"extraneous whitespace seen before xref","");
          damagedPDF((QPDFExc *)local_110,this,(string *)local_1f8,-1,&local_1b0);
          warn(this,(QPDFExc *)local_110);
          QPDFExc::~QPDFExc((QPDFExc *)local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_1b0 + 0x10U)) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
          }
        }
        for (lVar3 = 4;
            (*(byte *)((long)&local_1d0 + lVar3) - 9 < 5 ||
            (*(byte *)((long)&local_1d0 + lVar3) == 0x20)); lVar3 = lVar3 + 1) {
        }
        local_1d8 = read_xrefTable(this,lVar3 + local_1d8);
      }
      else {
        local_1d8 = read_xrefStream(this,local_1d8);
      }
      p_Var20 = &local_90._M_impl.super__Rb_tree_header;
      p_Var10 = &p_Var20->_M_header;
      for (p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
          p_Var6 = (&p_Var6->_M_left)[(long)*(size_t *)(p_Var6 + 1) < local_1d8]) {
        if (local_1d8 <= (long)*(size_t *)(p_Var6 + 1)) {
          p_Var10 = p_Var6;
        }
      }
      p_Var14 = p_Var20;
      if (((_Rb_tree_header *)p_Var10 != p_Var20) &&
         (p_Var14 = (_Rb_tree_header *)p_Var10,
         local_1d8 < (long)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
        p_Var14 = p_Var20;
      }
      if (p_Var14 != p_Var20) {
        pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f8,"loop detected following xref tables","");
        damagedPDF(pQVar7,this,(string *)local_110,-1,(string *)local_1f8);
        __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
    } while (local_1d8 != 0);
    local_1d8 = 0;
  }
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var1._M_head_impl)->trailer).super_BaseHandle == 0) {
    pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"unable to find trailer while reading xref","");
    damagedPDF(pQVar7,this,(string *)local_110,-1,(string *)local_1f8);
    __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/Size","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f8,(string *)&(_Var1._M_head_impl)->trailer);
  uVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_1f8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(size_t *)((long)&(_Var1._M_head_impl)->xref_table + 0x28) == 0) {
    uVar19 = 0;
  }
  else {
    lVar3 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->xref_table + 8));
    uVar19 = *(uint *)(lVar3 + 0x20);
  }
  uVar16 = uVar19;
  if (*(size_t *)((long)&(_Var1._M_head_impl)->deleted_objects + 0x28) != 0) {
    lVar3 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->deleted_objects + 8));
    uVar16 = *(uint *)(lVar3 + 0x20);
    if ((int)*(uint *)(lVar3 + 0x20) < (int)uVar19) {
      uVar16 = uVar19;
    }
  }
  if ((0 < (int)uVar2) && (uVar2 - 1 == uVar16)) goto LAB_002264bb;
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  uVar19 = -uVar2;
  if (0 < (int)uVar2) {
    uVar19 = uVar2;
  }
  uVar22 = 1;
  if (9 < uVar19) {
    uVar15 = (ulong)uVar19;
    uVar9 = 4;
    do {
      uVar22 = uVar9;
      uVar8 = (uint)uVar15;
      if (uVar8 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_00226111;
      }
      if (uVar8 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_00226111;
      }
      if (uVar8 < 10000) goto LAB_00226111;
      uVar15 = uVar15 / 10000;
      uVar9 = uVar22 + 4;
    } while (99999 < uVar8);
    uVar22 = uVar22 + 1;
  }
LAB_00226111:
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct((ulong)local_130,(char)uVar22 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_130[0]),uVar22,uVar19);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x28174f);
  local_150 = &local_140;
  plVar11 = plVar4 + 2;
  if ((long *)*plVar4 == plVar11) {
    local_140 = *plVar11;
    lStack_138 = plVar4[3];
  }
  else {
    local_140 = *plVar11;
    local_150 = (long *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)plVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar12 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar12) {
    local_160 = *puVar12;
    lStack_158 = plVar4[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar12;
    local_170 = (ulong *)*plVar4;
  }
  local_168 = plVar4[1];
  *plVar4 = (long)puVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar2 = -uVar16;
  if (0 < (int)uVar16) {
    uVar2 = uVar16;
  }
  uVar19 = 1;
  if (9 < uVar2) {
    uVar15 = (ulong)uVar2;
    uVar22 = 4;
    do {
      uVar19 = uVar22;
      uVar9 = (uint)uVar15;
      if (uVar9 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_0022627d;
      }
      if (uVar9 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_0022627d;
      }
      if (uVar9 < 10000) goto LAB_0022627d;
      uVar15 = uVar15 / 10000;
      uVar22 = uVar19 + 4;
    } while (99999 < uVar9);
    uVar19 = uVar19 + 1;
  }
LAB_0022627d:
  local_190 = local_180;
  std::__cxx11::string::_M_construct((ulong)&local_190,(char)uVar19 - (char)((int)uVar16 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_190),uVar19,uVar2);
  uVar15 = 0xf;
  if (local_170 != &local_160) {
    uVar15 = local_160;
  }
  if (uVar15 < (ulong)(local_188 + local_168)) {
    uVar15 = 0xf;
    if (local_190 != local_180) {
      uVar15 = local_180[0];
    }
    if (uVar15 < (ulong)(local_188 + local_168)) goto LAB_002262f5;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_002262f5:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_190);
  }
  local_1d0 = &local_1c0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_1c0 = *plVar4;
    uStack_1b8 = puVar5[3];
  }
  else {
    local_1c0 = *plVar4;
    local_1d0 = (long *)*puVar5;
  }
  local_1c8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  psVar13 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_1b0.field_2._M_allocated_capacity = *psVar13;
    local_1b0.field_2._8_8_ = plVar4[3];
    local_1b0._M_dataplus._M_p = (pointer)((long)&local_1b0 + 0x10U);
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar13;
    local_1b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar13;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  damagedPDF((QPDFExc *)local_110,this,(string *)local_1f8,-1,&local_1b0);
  warn(this,(QPDFExc *)local_110);
  QPDFExc::~QPDFExc((QPDFExc *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_1b0 + 0x10U)) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
LAB_002264bb:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->deleted_objects)._M_t);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var6 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->xref_table + 0x18);
  p_Var10 = (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8);
  if (p_Var6 != p_Var10) {
    uVar15 = 0xffffffff;
    uVar23 = 0;
    do {
      if (0 < (int)p_Var6[1]._M_color && p_Var6[1]._M_color == (_Rb_tree_color)uVar15) {
        removeObject(this,(QPDFObjGen)(uVar23 | uVar15 & 0xffffffff));
      }
      uVar15 = *(ulong *)(p_Var6 + 1);
      uVar23 = uVar15 & 0xffffffff00000000;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var10);
  }
  std::
  _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
QPDF::read_xref(qpdf_offset_t xref_offset)
{
    std::map<int, int> free_table;
    std::set<qpdf_offset_t> visited;
    while (xref_offset) {
        visited.insert(xref_offset);
        char buf[7];
        memset(buf, 0, sizeof(buf));
        m->file->seek(xref_offset, SEEK_SET);
        // Some files miss the mark a little with startxref. We could do a better job of searching
        // in the neighborhood for something that looks like either an xref table or stream, but the
        // simple heuristic of skipping whitespace can help with the xref table case and is harmless
        // with the stream case.
        bool done = false;
        bool skipped_space = false;
        while (!done) {
            char ch;
            if (1 == m->file->read(&ch, 1)) {
                if (util::is_space(ch)) {
                    skipped_space = true;
                } else {
                    m->file->unreadCh(ch);
                    done = true;
                }
            } else {
                QTC::TC("qpdf", "QPDF eof skipping spaces before xref", skipped_space ? 0 : 1);
                done = true;
            }
        }

        m->file->read(buf, sizeof(buf) - 1);
        // The PDF spec says xref must be followed by a line terminator, but files exist in the wild
        // where it is terminated by arbitrary whitespace.
        if ((strncmp(buf, "xref", 4) == 0) && util::is_space(buf[4])) {
            if (skipped_space) {
                QTC::TC("qpdf", "QPDF xref skipped space");
                warn(damagedPDF("", -1, "extraneous whitespace seen before xref"));
            }
            QTC::TC(
                "qpdf",
                "QPDF xref space",
                ((buf[4] == '\n')       ? 0
                     : (buf[4] == '\r') ? 1
                     : (buf[4] == ' ')  ? 2
                                        : 9999));
            int skip = 4;
            // buf is null-terminated, and util::is_space('\0') is false, so this won't overrun.
            while (util::is_space(buf[skip])) {
                ++skip;
            }
            xref_offset = read_xrefTable(xref_offset + skip);
        } else {
            xref_offset = read_xrefStream(xref_offset);
        }
        if (visited.count(xref_offset) != 0) {
            QTC::TC("qpdf", "QPDF xref loop");
            throw damagedPDF("", -1, "loop detected following xref tables");
        }
    }

    if (!m->trailer) {
        throw damagedPDF("", -1, "unable to find trailer while reading xref");
    }
    int size = m->trailer.getKey("/Size").getIntValueAsInt();
    int max_obj = 0;
    if (!m->xref_table.empty()) {
        max_obj = m->xref_table.rbegin()->first.getObj();
    }
    if (!m->deleted_objects.empty()) {
        max_obj = std::max(max_obj, *(m->deleted_objects.rbegin()));
    }
    if ((size < 1) || (size - 1 != max_obj)) {
        QTC::TC("qpdf", "QPDF xref size mismatch");
        warn(damagedPDF(
            "",
            -1,
            ("reported number of objects (" + std::to_string(size) +
             ") is not one plus the highest object number (" + std::to_string(max_obj) + ")")));
    }

    // We no longer need the deleted_objects table, so go ahead and clear it out to make sure we
    // never depend on its being set.
    m->deleted_objects.clear();

    // Make sure we keep only the highest generation for any object.
    QPDFObjGen last_og{-1, 0};
    for (auto const& item: m->xref_table) {
        auto id = item.first.getObj();
        if (id == last_og.getObj() && id > 0) {
            removeObject(last_og);
        }
        last_og = item.first;
    }
}